

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUnate.c
# Opt level: O2

void Gia_ManCheckUnateTest(Gia_Man_t *p,int fComputeAll,int fVerbose)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  abctime aVar3;
  void *__ptr;
  abctime aVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  bool bVar9;
  int local_40;
  
  if (fComputeAll != 0) {
    Gia_ManCheckUnateVecTest(p,fVerbose);
    return;
  }
  aVar3 = Abc_Clock();
  uVar7 = p->vCis->nSize;
  __ptr = calloc((long)(int)uVar7 + 1,1);
  if (fVerbose == 0) {
    uVar8 = 0;
    if (0 < (int)uVar7) {
      uVar8 = uVar7;
    }
  }
  else {
    printf("Inputs  : ");
    uVar8 = 0;
    if (0 < (int)uVar7) {
      uVar8 = uVar7;
    }
    uVar5 = 0;
    uVar7 = uVar8;
    while( true ) {
      bVar9 = uVar7 == 0;
      uVar7 = uVar7 - 1;
      if (bVar9) break;
      printf("%d",(ulong)uVar5 % 10);
      uVar5 = uVar5 + 1;
    }
    putchar(10);
  }
  uVar7 = 0;
  uVar5 = 0;
  local_40 = 0;
  do {
    pVVar1 = p->vCos;
    if (pVVar1->nSize <= (int)uVar7) {
      free(__ptr);
      iVar2 = 0x7bbdb6;
      printf("Ins/Outs = %4d/%4d.  Total supp = %5d.  Total unate = %5d.\n",
             (ulong)(uint)p->vCis->nSize,(ulong)(uint)pVVar1->nSize,(ulong)(local_40 + uVar5),
             (ulong)uVar5);
      Abc_Print(iVar2,"%s =","Total time");
      aVar4 = Abc_Clock();
      Abc_Print(iVar2,"%9.2f sec\n",(double)(aVar4 - aVar3) / 1000000.0);
      return;
    }
    for (uVar6 = 0; uVar8 != uVar6; uVar6 = uVar6 + 1) {
      iVar2 = Gia_ManCheckUnate(p,(int)uVar6,uVar7);
      switch(iVar2) {
      case 0:
        *(undefined1 *)((long)__ptr + uVar6) = 0x2e;
        local_40 = local_40 + 1;
        break;
      case 1:
        *(undefined1 *)((long)__ptr + uVar6) = 0x6e;
        goto LAB_0064cab8;
      case 2:
        *(undefined1 *)((long)__ptr + uVar6) = 0x70;
LAB_0064cab8:
        uVar5 = uVar5 + 1;
        break;
      case 3:
        *(undefined1 *)((long)__ptr + uVar6) = 0x20;
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaUnate.c"
                      ,0xec,"void Gia_ManCheckUnateTest(Gia_Man_t *, int, int)");
      }
    }
    if (fVerbose != 0) {
      printf("Out%4d : %s\n",(ulong)uVar7,__ptr);
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

void Gia_ManCheckUnateTest( Gia_Man_t * p, int fComputeAll, int fVerbose )
{
    if ( fComputeAll )
        Gia_ManCheckUnateVecTest( p, fVerbose );
    else
    {
        abctime clk = Abc_Clock();
        int i, o, nVars = Gia_ManCiNum(p);
        int nUnate = 0, nNonUnate = 0;
        char * pBuffer = ABC_CALLOC( char, nVars+1 );
        if ( fVerbose )
        {
            printf( "Inputs  : " );
            for ( i = 0; i < nVars; i++ )
                printf( "%d", i % 10 );
            printf( "\n" );
        }
        for ( o = 0; o < Gia_ManCoNum(p); o++ )
        {
            for ( i = 0; i < nVars; i++ )
            {
                int Res = Gia_ManCheckUnate( p, i, o );
                if ( Res == 3 )       pBuffer[i] = ' ';
                else if ( Res == 2 )  pBuffer[i] = 'p', nUnate++;
                else if ( Res == 1 )  pBuffer[i] = 'n', nUnate++;
                else if ( Res == 0 )  pBuffer[i] = '.', nNonUnate++;
                else assert( 0 );
            }
            if ( fVerbose )
                printf( "Out%4d : %s\n", o, pBuffer );
        }
        ABC_FREE( pBuffer );
        // print stats
        printf( "Ins/Outs = %4d/%4d.  Total supp = %5d.  Total unate = %5d.\n",
            Gia_ManCiNum(p), Gia_ManCoNum(p), nUnate+nNonUnate, nUnate );
        ABC_PRT( "Total time", Abc_Clock() - clk );
    }
}